

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O3

void on_connection_state_changed
               (void *context,CONNECTION_STATE new_connection_state,
               CONNECTION_STATE previous_connection_state)

{
  int iVar1;
  SESSION_STATE session_state;
  
  if (previous_connection_state == CONNECTION_STATE_OPENED ||
      new_connection_state != CONNECTION_STATE_OPENED) {
    if (new_connection_state != CONNECTION_STATE_CLOSE_RCVD) {
      if (new_connection_state == CONNECTION_STATE_ERROR) {
        session_state = SESSION_STATE_ERROR;
        goto LAB_00171921;
      }
      if (new_connection_state != CONNECTION_STATE_END) {
        return;
      }
    }
    session_state = SESSION_STATE_DISCARDING;
  }
  else {
    if ((*(int *)((long)context + 0x10) != 1) ||
       (iVar1 = send_begin((SESSION_INSTANCE *)context), iVar1 != 0)) {
      return;
    }
    session_state = SESSION_STATE_BEGIN_SENT;
  }
LAB_00171921:
  session_set_state((SESSION_INSTANCE *)context,session_state);
  return;
}

Assistant:

static void on_connection_state_changed(void* context, CONNECTION_STATE new_connection_state, CONNECTION_STATE previous_connection_state)
{
    (void)previous_connection_state;

    AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)context;

    if (new_connection_state == CONNECTION_STATE_START)
    {
        // connection is using x509 authentication.
        // At this point uamqp's connection only raises CONNECTION_STATE_START when using X509 auth.
        // So that should be all we expect to consider the amqp_connection_handle opened.
        if (instance->has_cbs == false || instance->has_sasl_mechanism == false)
        {
            update_state(instance, AMQP_CONNECTION_STATE_OPENED);
        }
    }
    else if (new_connection_state == CONNECTION_STATE_OPENED)
    {
        update_state(instance, AMQP_CONNECTION_STATE_OPENED);
    }
    else if (new_connection_state == CONNECTION_STATE_END)
    {
        update_state(instance, AMQP_CONNECTION_STATE_CLOSED);
    }
    else if (new_connection_state == CONNECTION_STATE_ERROR || new_connection_state == CONNECTION_STATE_DISCARDING)
    {
        update_state(instance, AMQP_CONNECTION_STATE_ERROR);
    }
}